

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_dmc.c
# Opt level: O0

void * NES_DMC_np_Create(UINT32 clock,UINT32 rate)

{
  int local_28;
  int local_24;
  int t;
  int c;
  NES_DMC *dmc;
  UINT32 rate_local;
  UINT32 clock_local;
  
  _rate_local = calloc(1,0x40128);
  if (_rate_local == (void *)0x0) {
    _rate_local = (void *)0x0;
  }
  else {
    NES_DMC_np_SetClock(_rate_local,clock);
    NES_DMC_np_SetRate(_rate_local,rate);
    *(undefined4 *)((long)_rate_local + 0x40010) = 1;
    *(undefined4 *)((long)_rate_local + 0x40014) = 1;
    *(undefined4 *)((long)_rate_local + 0x40008) = 1;
    *(undefined4 *)((long)_rate_local + 0x40018) = 0;
    *(undefined4 *)((long)_rate_local + 0x4000c) = 1;
    *(undefined4 *)((long)_rate_local + 0x4001c) = 1;
    *(undefined4 *)((long)_rate_local + 0x40020) = 1;
    *(undefined4 *)((long)_rate_local + 0x40024) = 0;
    *(undefined4 *)((long)_rate_local + 8) = 0;
    *(undefined4 *)((long)_rate_local + 0x20008) = 0;
    *(undefined8 *)((long)_rate_local + 0x400f8) = 0;
    *(undefined4 *)((long)_rate_local + 0x40100) = 0;
    *(undefined4 *)((long)_rate_local + 0x40104) = 0x1d22;
    *(undefined4 *)((long)_rate_local + 0x4010c) = 4;
    for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
      for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
        *(undefined4 *)((long)_rate_local + (long)local_28 * 4 + (long)local_24 * 0xc + 0x4002c) =
             0x80;
      }
    }
  }
  return _rate_local;
}

Assistant:

void* NES_DMC_np_Create(UINT32 clock, UINT32 rate)
{
	NES_DMC* dmc;
	int c, t;

	dmc = (NES_DMC*)calloc(1, sizeof(NES_DMC));
	if (dmc == NULL)
		return NULL;

	NES_DMC_np_SetClock(dmc, clock);
	NES_DMC_np_SetRate(dmc, rate);
	dmc->option[OPT_ENABLE_4011] = 1;
	dmc->option[OPT_ENABLE_PNOISE] = 1;
	dmc->option[OPT_UNMUTE_ON_RESET] = 1;
	dmc->option[OPT_DPCM_ANTI_CLICK] = 0;
	dmc->option[OPT_NONLINEAR_MIXER] = 1;
	dmc->option[OPT_RANDOMIZE_NOISE] = 1;
	dmc->option[OPT_TRI_MUTE] = 1;
	dmc->option[OPT_TRI_NULL] = 0;
	dmc->tnd_table[0][0][0][0] = 0;
	dmc->tnd_table[1][0][0][0] = 0;

	dmc->apu = NULL;
	dmc->frame_sequence_count = 0;
	dmc->frame_sequence_length = 7458;
	dmc->frame_sequence_steps = 4;

	for(c=0;c<2;++c)
		for(t=0;t<3;++t)
			dmc->sm[c][t] = 128;

	return dmc;
}